

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void xmlListSort(xmlListPtr l)

{
  xmlListPtr l2;
  
  if ((l != (xmlListPtr)0x0) && (l->sentinel->next != l->sentinel)) {
    l2 = xmlListDup(l);
    if (l2 != (xmlListPtr)0x0) {
      xmlListClear(l);
      xmlListMerge(l,l2);
      xmlListDelete(l2);
      return;
    }
  }
  return;
}

Assistant:

void
xmlListSort(xmlListPtr l)
{
    xmlListPtr lTemp;

    if (l == NULL)
        return;
    if(xmlListEmpty(l))
        return;

    /* I think that the real answer is to implement quicksort, the
     * alternative is to implement some list copying procedure which
     * would be based on a list copy followed by a clear followed by
     * an insert. This is slow...
     */

    if (NULL ==(lTemp = xmlListDup(l)))
        return;
    xmlListClear(l);
    xmlListMerge(l, lTemp);
    xmlListDelete(lTemp);
    return;
}